

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivy.h
# Opt level: O2

Ivy_Obj_t * Ivy_ObjChild0Equiv(Ivy_Obj_t *pObj)

{
  ulong uVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivy.h"
                  ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
  }
  uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  if (uVar1 != 0) {
    return (Ivy_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar1 + 0x48));
  }
  return (Ivy_Obj_t *)0x0;
}

Assistant:

static inline Ivy_Obj_t *  Ivy_ObjChild0Equiv( Ivy_Obj_t * pObj ) { assert( !Ivy_IsComplement(pObj) ); return Ivy_ObjFanin0(pObj)? Ivy_NotCond(Ivy_ObjFanin0(pObj)->pEquiv, Ivy_ObjFaninC0(pObj)) : NULL;  }